

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typemapper.hpp
# Opt level: O2

MethodHandle * __thiscall
jsonrpccxx::GetHandle<product,int>
          (MethodHandle *__return_storage_ptr__,jsonrpccxx *this,function<product_(int)> *f)

{
  function<product_(int)> *method;
  function<product_(int)> local_30;
  
  std::function<product_(int)>::function(&local_30,(function<product_(int)> *)this);
  methodHandle<product,int>(__return_storage_ptr__,(jsonrpccxx *)&local_30,method);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

MethodHandle GetHandle(std::function<ReturnType(ParamTypes...)> f) {
    return methodHandle(f);
  }